

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemMakeWriteable(Mem *pMem)

{
  byte *pbVar1;
  int iVar2;
  
  if ((pMem->flags & 0x12) != 0) {
    if (((pMem->flags >> 0xe & 1) != 0) && (iVar2 = sqlite3VdbeMemExpandBlob(pMem), iVar2 != 0)) {
      return 7;
    }
    if (((pMem->szMalloc == 0) || (pMem->z != pMem->zMalloc)) &&
       (iVar2 = vdbeMemAddTerminator(pMem), iVar2 != 0)) {
      return iVar2;
    }
  }
  pbVar1 = (byte *)((long)&pMem->flags + 1);
  *pbVar1 = *pbVar1 & 0xef;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemMakeWriteable(Mem *pMem){
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  if( (pMem->flags & (MEM_Str|MEM_Blob))!=0 ){
    if( ExpandBlob(pMem) ) return SQLITE_NOMEM;
    if( pMem->szMalloc==0 || pMem->z!=pMem->zMalloc ){
      int rc = vdbeMemAddTerminator(pMem);
      if( rc ) return rc;
    }
  }
  pMem->flags &= ~MEM_Ephem;
#ifdef SQLITE_DEBUG
  pMem->pScopyFrom = 0;
#endif

  return SQLITE_OK;
}